

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O3

void duckdb::IntegralCompressFunction<duckdb::hugeint_t,unsigned_short>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  idx_t count;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  allocate_function_ptr_t p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  hugeint_t *ldata;
  unsigned_short *puVar6;
  byte bVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  SelectionVector *pSVar9;
  reference pvVar10;
  VectorBuffer *pVVar11;
  ulong uVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  _Head_base<0UL,_unsigned_long_*,_false> _Var14;
  idx_t idx_in_entry;
  ulong uVar15;
  idx_t iVar16;
  hugeint_t hVar17;
  hugeint_t min_val;
  optional_idx dict_size;
  duckdb dVar18;
  element_type *in_stack_ffffffffffffff38;
  element_type *peVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  hugeint_t *local_b0;
  hugeint_t local_a8;
  idx_t local_90;
  hugeint_t *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pvVar10 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  local_a8.lower = *(uint64_t *)pvVar10->data;
  local_a8.upper = *(uint64_t *)((long)pvVar10->data + 8);
  pvVar10 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar1 = pvVar10->vector_type;
  local_b0 = &local_a8;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    dVar18 = SUB81(in_stack_ffffffffffffff38,0);
    puVar6 = (unsigned_short *)result->data;
    ldata = (hugeint_t *)pvVar10->data;
    FlatVector::VerifyFlatVector(pvVar10);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<duckdb::hugeint_t,unsigned_short,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<duckdb::hugeint_t,unsigned_short>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t_const&)_1_>
              (ldata,puVar6,count,&pvVar10->validity,&result->validity,&local_b0,(bool)dVar18);
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(pvVar10);
      pVVar11 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar10->buffer);
      local_78.sel = (SelectionVector *)pVVar11[1].data.allocator.ptr;
      if (((Allocator *)local_78.sel != (Allocator *)0xffffffffffffffff) &&
         (iVar16 = optional_idx::GetIndex((optional_idx *)&local_78), iVar16 * 2 <= count)) {
        DictionaryVector::VerifyDictionary(pvVar10);
        pVVar11 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar10->auxiliary);
        if (*(char *)&pVVar11[1]._vptr_VectorBuffer == '\0') {
          puVar6 = (unsigned_short *)result->data;
          local_88 = (hugeint_t *)pVVar11[1].data.pointer;
          local_90 = optional_idx::GetIndex((optional_idx *)&local_78);
          dVar18 = SUB81(in_stack_ffffffffffffff38,0);
          FlatVector::VerifyFlatVector((Vector *)(pVVar11 + 1));
          FlatVector::VerifyFlatVector(result);
          UnaryExecutor::
          ExecuteFlat<duckdb::hugeint_t,unsigned_short,duckdb::UnaryLambdaWrapper,duckdb::IntegralCompressFunction<duckdb::hugeint_t,unsigned_short>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t_const&)_1_>
                    (local_88,puVar6,local_90,(ValidityMask *)&pVVar11[1].data.allocated_size,
                     &result->validity,&local_b0,(bool)dVar18);
          DictionaryVector::VerifyDictionary(pvVar10);
          pVVar11 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar10->buffer);
          iVar16 = optional_idx::GetIndex((optional_idx *)&local_78);
          Vector::Dictionary(result,result,iVar16,(SelectionVector *)(pVVar11 + 1),count);
          return;
        }
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      pdVar2 = result->data;
      pdVar3 = pvVar10->data;
      puVar4 = (pvVar10->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      local_78.sel = *(SelectionVector **)pdVar3;
      local_78.data = *(data_ptr_t *)(pdVar3 + 8);
      hVar17 = hugeint_t::operator-((hugeint_t *)&local_78,&local_a8);
      *(short *)pdVar2 = (short)hVar17.lower;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(pvVar10,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pSVar9 = local_78.sel;
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        iVar16 = 0;
        do {
          hVar17 = hugeint_t::operator-((hugeint_t *)&stack0xffffffffffffff38,&local_a8);
          *(short *)(pdVar2 + iVar16 * 2) = (short)hVar17.lower;
          iVar16 = iVar16 + 1;
        } while (count != iVar16);
      }
    }
    else if (count != 0) {
      p_Var5 = (allocate_function_ptr_t)pSVar9->sel_vector;
      uVar15 = 0;
      do {
        p_Var8 = p_Stack_c0;
        uVar12 = uVar15;
        if (p_Var5 != (allocate_function_ptr_t)0x0) {
          uVar12 = (ulong)*(uint *)(p_Var5 + uVar15 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar12 >> 6]
             >> (uVar12 & 0x3f) & 1) == 0) {
          _Var14._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          peVar19 = in_stack_ffffffffffffff38;
          if (_Var14._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&stack0xffffffffffffff38,&local_80);
            peVar19 = (element_type *)0x0;
            p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = in_stack_ffffffffffffff38;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var8;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var14._M_head_impl =
                 (pTVar13->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var14._M_head_impl;
          }
          bVar7 = (byte)uVar15 & 0x3f;
          _Var14._M_head_impl[uVar15 >> 6] =
               _Var14._M_head_impl[uVar15 >> 6] &
               (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        }
        else {
          peVar19 = *(element_type **)(local_78.data + uVar12 * 0x10);
          p_Stack_c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                        (local_78.data + uVar12 * 0x10 + 8);
          hVar17 = hugeint_t::operator-((hugeint_t *)&stack0xffffffffffffff38,&local_a8);
          *(short *)(pdVar2 + uVar15 * 2) = (short)hVar17.lower;
        }
        uVar15 = uVar15 + 1;
        in_stack_ffffffffffffff38 = peVar19;
      } while (count != uVar15);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}